

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_editor.cpp
# Opt level: O1

void __thiscall lsim::gui::CircuitEditor::ui_popup_edit_segment(CircuitEditor *this)

{
  bool bVar1;
  ImVec2 local_18;
  Point local_10;
  
  bVar1 = ImGui::BeginPopup("edit_segment",0);
  if (bVar1) {
    local_18.x = 0.0;
    local_18.y = 0.0;
    bVar1 = ImGui::Selectable("Attach wire",false,0,&local_18);
    if (bVar1) {
      this->m_state = CS_CREATE_WIRE;
      local_18 = *(ImVec2 *)&(this->m_wire_start).m_position;
      local_10 = (Point)local_18;
      std::vector<lsim::Point,std::allocator<lsim::Point>>::_M_assign_aux<lsim::Point_const*>
                ((vector<lsim::Point,std::allocator<lsim::Point>> *)&this->m_line_anchors,&local_18)
      ;
      this->m_segment_start = (this->m_wire_start).m_position;
    }
    ImGui::EndPopup();
  }
  return;
}

Assistant:

void CircuitEditor::ui_popup_edit_segment() {
	if (ImGui::BeginPopup(POPUP_EDIT_SEGMENT)) {
		if (ImGui::Selectable("Attach wire")) {
			m_state = CS_CREATE_WIRE;
			m_line_anchors = { m_wire_start.m_position, m_wire_start.m_position };
			m_segment_start = m_wire_start.m_position;
		}
		ImGui::EndPopup();
	}
}